

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O2

char * json::load<array_float_var>(char *in,size_t len,array_float_var *t,int options)

{
  bool bVar1;
  char *pcVar2;
  size_t props_size;
  LoadObject serializer;
  prop_map props;
  size_t local_25f8;
  LoadObject local_25f0;
  property local_25b8 [300];
  
  local_25f8 = 0;
  pcVar2 = skip_ws(in);
  if (*pcVar2 == '{') {
    pcVar2 = load_props(pcVar2 + 1,in + len,&local_25b8,&local_25f8);
    if (*pcVar2 == '}') {
      std::
      __sort<json::property*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(json::property_const&,json::property_const&)>>
                (local_25b8,local_25b8 + local_25f8,
                 (_Iter_comp_iter<bool_(*)(const_json::property_&,_const_json::property_&)>)0x13ab78
                );
      local_25f0.props_size = local_25f8;
      local_25f0.current = 0;
      local_25f0.error_pos = (char *)0x0;
      local_25f0._prev_name = "";
      local_25f0.props = &local_25b8;
      local_25f0.options = options;
      local_25f0.start = in;
      bVar1 = serialize<json::LoadObject>(&local_25f0,t);
      if (!bVar1) {
        return local_25f0.error_pos;
      }
      if (local_25f0.current < local_25f0.props_size) {
        return local_25b8[local_25f0.current].param.str;
      }
      pcVar2 = skip_ws(pcVar2 + 1);
      return pcVar2;
    }
  }
  return pcVar2 + -1;
}

Assistant:

const char* load(const char* in, size_t len, V& t, int options) {
	const char* start = in;
	prop_map props;
	size_t props_size = 0;
	in = skip_ws(in);

	if (*in != '{')
		return in - 1;										 // error
	in = load_props(in + 1, start + len, props, props_size); // load prop map for child object
	if (*in != '}')
		return in - 1; // error

	std::sort(props, props + props_size, compare_props);

	LoadObject serializer(props, props_size, start, options);
	if (!serialize(serializer, t))
		return serializer.error_pos;

	if (serializer.current < serializer.props_size)
		return props[serializer.current].param.str;

	in = skip_ws(in + 1); // skip whitespace after
	return in;
}